

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizes
          (FileDescriptorProto *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *data;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint uVar2;
  int32 iVar3;
  Type *pTVar4;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  int i;
  int iVar5;
  FileOptions *value_03;
  SourceCodeInfo *value_04;
  
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(1,this->name_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(2,this->package_,output);
  }
  this_00 = &this->dependency_;
  for (iVar5 = 0; iVar5 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = iVar5 + 1) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    data = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormat::VerifyUTF8StringFallback(data,(int)pTVar4->_M_string_length,SERIALIZE);
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::WriteString(3,pTVar4,output);
  }
  for (iVar5 = 0; iVar5 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = iVar5 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->message_type_).super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value,output);
  }
  for (iVar5 = 0; iVar5 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = iVar5 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_00,output);
  }
  for (iVar5 = 0; iVar5 < (this->service_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = iVar5 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(this->service_).super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)value_01,output);
  }
  for (iVar5 = 0; iVar5 < (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = iVar5 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)value_02,output);
  }
  uVar2 = this->_has_bits_[0];
  if ((uVar2 >> 9 & 1) != 0) {
    value_03 = this->options_;
    if (value_03 == (FileOptions *)0x0) {
      value_03 = *(FileOptions **)(default_instance_ + 0xb8);
    }
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value_03,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 >> 10 & 1) != 0) {
    value_04 = this->source_code_info_;
    if (value_04 == (SourceCodeInfo *)0x0) {
      value_04 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
    }
    internal::WireFormatLite::WriteMessageMaybeToArray(9,(MessageLite *)value_04,output);
  }
  for (iVar5 = 0; iVar5 < (this->public_dependency_).current_size_; iVar5 = iVar5 + 1) {
    iVar3 = public_dependency(this,iVar5);
    internal::WireFormatLite::WriteInt32(10,iVar3,output);
  }
  for (iVar5 = 0; iVar5 < (this->weak_dependency_).current_size_; iVar5 = iVar5 + 1) {
    iVar3 = weak_dependency(this,iVar5);
    internal::WireFormatLite::WriteInt32(0xb,iVar3,output);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void FileDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->package(), output);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
  ::google::protobuf::internal::WireFormat::VerifyUTF8String(
    this->dependency(i).data(), this->dependency(i).length(),
    ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->dependency(i), output);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->message_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->enum_type(i), output);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->service(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->extension(i), output);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->options(), output);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, this->source_code_info(), output);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      10, this->public_dependency(i), output);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      11, this->weak_dependency(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}